

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O2

void __thiscall
glcts::PipelineStatisticsQueryTestFunctional6::deinitObjects
          (PipelineStatisticsQueryTestFunctional6 *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  if ((this->super_PipelineStatisticsQueryTestFunctionalBase).m_po_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x448))();
    (this->super_PipelineStatisticsQueryTestFunctionalBase).m_po_id = 0;
  }
  return;
}

Assistant:

void PipelineStatisticsQueryTestFunctional6::deinitObjects()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);

		m_po_id = 0;
	}
}